

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O0

void __thiscall MeanField::CPU::CRF::filterGaussian(CRF *this,float *unaries)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer kernel;
  int local_30;
  int local_2c;
  int j_2;
  int i_2;
  int j_1;
  int i_1;
  int j;
  int i;
  float *unaries_local;
  CRF *this_local;
  
  if ((this->separable & 1U) == 0) {
    for (i_1 = 0; i_1 < this->height; i_1 = i_1 + 1) {
      for (j_1 = 0; j_1 < this->width; j_1 = j_1 + 1) {
        pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->spatialKernel);
        pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->gaussianOut);
        Filtering::applyGaussianKernel
                  (pfVar1,unaries,pfVar2,this->spatialSD,this->dimensions,j_1,i_1,this->width,
                   this->height);
      }
    }
  }
  else {
    for (i_2 = 0; i_2 < this->height; i_2 = i_2 + 1) {
      for (j_2 = 0; j_2 < this->width; j_2 = j_2 + 1) {
        pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->filterOutTmp);
        pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->spatialKernel);
        Filtering::applyGaussianKernelX
                  (unaries,pfVar1,pfVar2,this->spatialSD,this->dimensions,j_2,i_2,this->width,
                   this->height);
      }
    }
    for (local_2c = 0; local_2c < this->height; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < this->width; local_30 = local_30 + 1) {
        pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->filterOutTmp);
        pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->gaussianOut);
        kernel = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->spatialKernel);
        Filtering::applyGaussianKernelY
                  (pfVar1,pfVar2,kernel,this->spatialSD,this->dimensions,local_30,local_2c,
                   this->width,this->height);
      }
    }
  }
  return;
}

Assistant:

void CRF::filterGaussian(const float *unaries) {
    if (!separable) {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernel(spatialKernel.get(), unaries, gaussianOut.get(), spatialSD, dimensions, j, i, width, height);
            }
        }
    }
    else {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelX(unaries, filterOutTmp.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }

        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelY(filterOutTmp.get(), gaussianOut.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }
    }
}